

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryGetEntry(Impl *this,StringPtr name)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Base_ptr *pp_Var3;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  StringPtr local_30;
  
  local_30.content.size_ = name.content.size_;
  local_30.content.ptr = name.content.ptr;
  p_Var5 = &(this->entries)._M_t._M_impl.super__Rb_tree_header;
  pp_Var3 = &(this->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var5->_M_header;
  while (p_Var1 = *pp_Var3, p_Var1 != (_Base_ptr)0x0) {
    bVar2 = StringPtr::operator<((StringPtr *)(p_Var1 + 1),&local_30);
    if (!bVar2) {
      p_Var6 = p_Var1;
    }
    pp_Var3 = &p_Var1->_M_left + bVar2;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var5) {
    MVar4.ptr = (EntryImpl *)0x0;
  }
  else {
    bVar2 = StringPtr::operator<(&local_30,(StringPtr *)(p_Var6 + 1));
    MVar4.ptr = (EntryImpl *)0x0;
    if (!bVar2) {
      MVar4.ptr = (EntryImpl *)&p_Var6[1]._M_left;
    }
  }
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)MVar4.ptr;
}

Assistant:

kj::Maybe<const EntryImpl&> tryGetEntry(kj::StringPtr name) const {
      auto iter = entries.find(name);
      if (iter == entries.end()) {
        return nullptr;
      } else {
        return iter->second;
      }
    }